

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O2

void client(void *arg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  undefined8 uStack_40;
  char msg [3];
  
  sVar4 = strlen(msg);
  iVar1 = (int)sVar4 + 1;
  iVar6 = -10;
  while( true ) {
    if (iVar6 == 0) {
      return;
    }
    iVar2 = nn_socket(1,0x50);
    if (iVar2 < 0) break;
    iVar3 = nn_connect(iVar2,"ipc://test-stress.ipc");
    if (iVar3 < 0) {
      pcVar5 = "nn_connect(cli_sock, SOCKET_ADDRESS) >= 0";
      uStack_40 = 0x59;
      goto LAB_0010187c;
    }
    nn_sleep(0x32);
    iVar3 = nn_send(iVar2,msg,(long)iVar1,0);
    nn_sleep(100);
    if (iVar3 != iVar1) {
      pcVar5 = "bytes == sz_msg";
      uStack_40 = 0x5f;
      goto LAB_0010187c;
    }
    nn_close(iVar2);
    iVar6 = iVar6 + 1;
  }
  pcVar5 = "cli_sock >= 0";
  uStack_40 = 0x58;
LAB_0010187c:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_stress.c"
          ,uStack_40);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void client(void *arg)
{
    intptr_t id = (intptr_t)arg;
    int bytes;
    char msg[3];
    int sz_msg;
    int i;

    msg[0] = 'A' + id%26;
    msg[1] = 'a';
    msg[2] = '\0';
    sz_msg = strlen (msg) + 1; // '\0' too

    for (i = 0; i < TEST_LOOPS; i++) {
        int cli_sock = nn_socket(AF_SP, NN_PUSH);
        msg[1] = 'a' + i%26;
        nn_assert(cli_sock >= 0);
        nn_assert(nn_connect(cli_sock, SOCKET_ADDRESS) >= 0);
        /*  Give time to allow for connect to establish. */
        nn_sleep(50);
        bytes = nn_send(cli_sock, msg, sz_msg, 0);
        /*  This would better be handled via semaphore or condvar. */
        nn_sleep(100);
        nn_assert(bytes == sz_msg);
        nn_close(cli_sock);
    }
}